

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionChecksLatency::RunImpl
          (TestsessionFixtureSessionChecksLatency *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_648 [8];
  sessionFixtureSessionChecksLatencyHelper fixtureHelper;
  bool ctorOk;
  TestsessionFixtureSessionChecksLatency *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  sessionFixtureSessionChecksLatencyHelper::sessionFixtureSessionChecksLatencyHelper
            ((sessionFixtureSessionChecksLatencyHelper *)local_648,&(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionChecksLatencyHelper>
            ((sessionFixtureSessionChecksLatencyHelper *)local_648,&(this->super_Test).m_details);
  sessionFixtureSessionChecksLatencyHelper::~sessionFixtureSessionChecksLatencyHelper
            ((sessionFixtureSessionChecksLatencyHelper *)local_648);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionChecksLatency) {
  createSession(1);
  object->setCheckLatency(true);
  CHECK(object->getCheckLatency());
}